

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmvmesh.cpp
# Opt level: O2

void __thiscall TPZMVGraphMesh::DrawMesh(TPZMVGraphMesh *this,int numcases)

{
  ofstream *this_00;
  ostream *poVar1;
  int iVar2;
  
  this->fNumCases = numcases;
  this->fNumSteps = 0;
  this_00 = &(this->super_TPZGraphMesh).fOutFile;
  poVar1 = std::operator<<((ostream *)this_00,"%HEADER");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)this_00,"Arquivo gerado por PZ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)this_00,"%RESULT\n1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,1);
  poVar1 = std::operator<<(poVar1," \'Caso Unico\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)this_00,"%RESULT.CASE");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,1);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,numcases);
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar2 = 0;
  if (numcases < 1) {
    numcases = iVar2;
  }
  while (numcases != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(this_00,iVar2 + 1);
    poVar1 = std::operator<<(poVar1," \'step");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
    numcases = numcases + -1;
    iVar2 = iVar2 + 1;
  }
  (*(this->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable[10])(this);
  (*(this->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable[0xc])(this,7);
  return;
}

Assistant:

void TPZMVGraphMesh::DrawMesh(int numcases) {
	
	fNumCases = numcases;
	fNumSteps = 0;
	(fOutFile) << "%HEADER" << endl;
	(fOutFile) << "Arquivo gerado por PZ" << endl;
	(fOutFile) << "%RESULT\n1" << endl;
	(fOutFile) << 1 << " 'Caso Unico'" << endl;
	(fOutFile) << "%RESULT.CASE" << endl;
	(fOutFile) << 1 << " " << numcases << endl;
	for(int i=0; i<numcases;i++) {
		(fOutFile) << (i+1) << " 'step" << i << "'" << endl;
	}
	DrawNodes();
	DrawConnectivity(ECube);
}